

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O2

void boost::deflate::inflate_stream_test::testInvalidSettings(IDecompressor *d)

{
  (*d->_vptr_IDecompressor[1])(d,7,0);
  (**(code **)(*test_suite::detail::current()::p + 0x30))
            (test_suite::detail::current()::p,"std::domain_error",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/inflate_stream.cpp"
             ,0x271,
             "static void boost::deflate::inflate_stream_test::testInvalidSettings(IDecompressor &)"
            );
  return;
}

Assistant:

static
    void testInvalidSettings(IDecompressor& d)
    {
        BOOST_TEST_THROWS(d.init(7), std::domain_error);
    }